

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_sgemm.h
# Opt level: O1

void ncnn::conv_im2col_sgemm_sse
               (Mat *bottom_blob,Mat *top_blob,Mat *kernel_tm,Mat *_bias,int kernel_w,int kernel_h,
               int stride_w,int stride_h,Option *opt)

{
  int *piVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  int iVar18;
  ulong uVar19;
  Allocator *pAVar20;
  size_t sVar21;
  void *pvVar22;
  size_t sVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  undefined4 uVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  uint uVar43;
  int iVar44;
  int iVar45;
  undefined4 extraout_var;
  void *__ptr;
  undefined4 extraout_var_00;
  float *pfVar46;
  uint uVar47;
  int iVar48;
  undefined4 *puVar49;
  uint uVar50;
  uint uVar51;
  long lVar52;
  ulong uVar53;
  float *pfVar54;
  ulong uVar55;
  float *pfVar56;
  int iVar57;
  void **ppvVar58;
  int iVar59;
  int *piVar60;
  long lVar61;
  float *pfVar62;
  int iVar63;
  int iVar64;
  int iVar65;
  void **ppvVar66;
  undefined4 *puVar67;
  ulong uVar68;
  int iVar69;
  uint uVar70;
  undefined4 *puVar71;
  float *pfVar72;
  int i;
  int iVar73;
  ulong uVar74;
  ulong uVar75;
  float *pfVar76;
  float *pfVar77;
  float fVar78;
  float fVar79;
  float fVar80;
  float fVar81;
  float fVar82;
  float fVar83;
  float fVar84;
  float fVar85;
  float fVar86;
  float fVar87;
  float fVar88;
  float fVar89;
  float fVar90;
  float fVar91;
  float fVar92;
  float fVar93;
  int L;
  void *ptr;
  Mat bottom_im2col;
  ulong local_e0;
  void *local_b8;
  undefined8 uStack_b0;
  void *local_a8;
  undefined8 uStack_a0;
  undefined4 uStack_98;
  undefined4 uStack_94;
  undefined4 uStack_90;
  Allocator *local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  long lStack_70;
  ulong local_68;
  int local_5c;
  ulong local_58;
  void *local_50;
  Mat *local_48;
  long local_40;
  void *local_38;
  
  iVar45 = bottom_blob->w;
  uVar50 = bottom_blob->c;
  uVar19 = bottom_blob->elemsize;
  uVar51 = top_blob->w;
  iVar18 = top_blob->h;
  local_50 = _bias->data;
  uVar43 = uVar51 * iVar18;
  iVar63 = kernel_h * kernel_w;
  uVar47 = uVar50 * iVar63;
  local_48 = top_blob;
  local_58 = (ulong)top_blob->c;
  pAVar20 = opt->workspace_allocator;
  uStack_98 = 0;
  uStack_94 = 0;
  uStack_90 = 0;
  local_a8 = (void *)0x0;
  uStack_a0._0_4_ = 0;
  uStack_a0._4_4_ = 0;
  local_88 = (Allocator *)0x0;
  uStack_80 = 0;
  local_78 = 0;
  lStack_70 = 0;
  local_a8 = (void *)0x0;
  uStack_a0._0_4_ = 0;
  uStack_a0._4_4_ = 0;
  piVar1 = (int *)0x0;
  uStack_98 = (undefined4)uVar19;
  uStack_94 = (undefined4)(uVar19 >> 0x20);
  uStack_90 = 1;
  local_88 = pAVar20;
  uStack_80 = CONCAT44(uVar43,2);
  local_78 = CONCAT44(1,uVar47);
  iVar44 = uVar43 * uVar47;
  lStack_70 = (long)iVar44;
  if (iVar44 != 0) {
    uVar74 = (long)iVar44 * uVar19 + 3 & 0xfffffffffffffffc;
    if (pAVar20 == (Allocator *)0x0) {
      local_b8 = (void *)0x0;
      iVar44 = posix_memalign(&local_b8,0x10,uVar74 + 4);
      local_a8 = local_b8;
      if (iVar44 != 0) {
        local_b8 = (void *)0x0;
        local_a8 = local_b8;
      }
    }
    else {
      iVar44 = (*pAVar20->_vptr_Allocator[2])(pAVar20,uVar74 + 4);
      local_a8 = (void *)CONCAT44(extraout_var,iVar44);
    }
    piVar1 = (int *)((long)local_a8 + uVar74);
    uStack_a0._0_4_ = SUB84(piVar1,0);
    uStack_a0._4_4_ = (undefined4)((ulong)piVar1 >> 0x20);
    *(undefined4 *)((long)local_a8 + uVar74) = 1;
  }
  if (0 < (int)uVar50) {
    local_38 = bottom_blob->data;
    local_40 = bottom_blob->cstep * bottom_blob->elemsize;
    local_5c = iVar18 * iVar63 * uVar51;
    local_e0 = 0;
    do {
      if (0 < kernel_h) {
        iVar69 = local_5c * (int)local_e0;
        iVar65 = 0;
        iVar44 = 0;
        do {
          local_68 = CONCAT44(local_68._4_4_,iVar44);
          if (0 < kernel_w) {
            iVar48 = 0;
            iVar64 = iVar65;
            do {
              if (0 < iVar18) {
                iVar73 = 0;
                iVar57 = iVar64;
                do {
                  if (0 < (int)uVar51) {
                    uVar74 = 0;
                    iVar59 = iVar57;
                    do {
                      *(undefined4 *)((long)local_a8 + uVar74 * 4 + (long)iVar69 * 4) =
                           *(undefined4 *)((long)local_38 + (long)iVar59 * 4 + local_40 * local_e0);
                      uVar74 = uVar74 + 1;
                      iVar59 = iVar59 + stride_w;
                    } while (uVar51 != uVar74);
                    iVar69 = iVar69 + (int)uVar74;
                  }
                  iVar73 = iVar73 + 1;
                  iVar57 = iVar57 + stride_h * iVar45;
                } while (iVar73 != iVar18);
              }
              iVar48 = iVar48 + 1;
              iVar64 = iVar64 + 1;
            } while (iVar48 != kernel_w);
          }
          iVar44 = iVar44 + 1;
          iVar65 = iVar65 + iVar45;
        } while (iVar44 != kernel_h);
      }
      local_e0 = local_e0 + 1;
    } while (local_e0 != uVar50);
  }
  uVar51 = uVar43 + 3;
  if (-1 < (int)uVar43) {
    uVar51 = uVar43;
  }
  pAVar20 = opt->workspace_allocator;
  piVar60 = (int *)0x0;
  uVar74 = ((long)(int)(iVar63 * uVar50 * 4) * uVar19 + 0xf & 0xfffffffffffffff0) / uVar19;
  lVar52 = (long)(int)(uVar43 + ((int)uVar51 >> 2) * -3) * uVar74;
  __ptr = (void *)0x0;
  if (lVar52 != 0) {
    uVar53 = lVar52 * uVar19 + 3 & 0xfffffffffffffffc;
    uStack_a0 = piVar1;
    if (pAVar20 == (Allocator *)0x0) {
      local_b8 = (void *)0x0;
      iVar45 = posix_memalign(&local_b8,0x10,uVar53 + 4);
      __ptr = local_b8;
      piVar1 = uStack_a0;
      if (iVar45 != 0) {
        local_b8 = (void *)0x0;
        __ptr = local_b8;
      }
    }
    else {
      iVar45 = (*pAVar20->_vptr_Allocator[2])(pAVar20,uVar53 + 4);
      __ptr = (void *)CONCAT44(extraout_var_00,iVar45);
      piVar1 = uStack_a0;
    }
    piVar60 = (int *)((long)__ptr + uVar53);
    *(undefined4 *)((long)__ptr + uVar53) = 1;
  }
  lVar52 = (long)(int)uVar43;
  if (0 < (int)uVar43 >> 2) {
    lVar61 = 0;
    uVar53 = 0;
    do {
      if (0 < (int)uVar47) {
        puVar67 = (undefined4 *)(uVar74 * uVar19 * uVar53 + (long)__ptr);
        puVar71 = (undefined4 *)((long)local_a8 + lVar61);
        uVar50 = uVar47;
        do {
          uVar24 = puVar71[1];
          uVar25 = puVar71[2];
          uVar26 = puVar71[3];
          *puVar67 = *puVar71;
          puVar67[1] = uVar24;
          puVar67[2] = uVar25;
          puVar67[3] = uVar26;
          puVar67 = puVar67 + 4;
          puVar71 = puVar71 + lVar52;
          uVar50 = uVar50 - 1;
        } while (uVar50 != 0);
      }
      uVar53 = uVar53 + 1;
      lVar61 = lVar61 + 0x10;
    } while (uVar53 != (uint)((int)uVar43 >> 2));
  }
  if ((uVar43 & 0xfffffffc) != uVar43) {
    lVar61 = (long)(int)(uVar43 & 0xfffffffc);
    puVar67 = (undefined4 *)(lVar61 * 4 + (long)local_a8);
    do {
      if (0 < (int)uVar47) {
        uVar50 = (uint)lVar61;
        uVar51 = uVar50 + 3;
        if (-1 < (int)uVar50) {
          uVar51 = uVar50;
        }
        puVar49 = (undefined4 *)
                  ((long)(int)(((int)uVar51 >> 2) + (uVar50 - (uVar51 & 0xfffffffc))) *
                   uVar74 * uVar19 + (long)__ptr);
        puVar71 = puVar67;
        uVar50 = uVar47;
        do {
          *puVar49 = *puVar71;
          puVar49 = puVar49 + 1;
          puVar71 = puVar71 + lVar52;
          uVar50 = uVar50 - 1;
        } while (uVar50 != 0);
      }
      lVar61 = lVar61 + 1;
      puVar67 = puVar67 + 1;
    } while (lVar61 < lVar52);
  }
  uVar50 = (int)local_58 >> 2;
  uVar53 = local_58 & 0xfffffffffffffffc;
  if (0 < (int)uVar50) {
    local_68 = (ulong)uVar50;
    uVar68 = 0;
    do {
      sVar21 = local_48->cstep;
      pvVar22 = local_48->data;
      sVar23 = local_48->elemsize;
      pfVar56 = (float *)(uVar68 * 4 * sVar21 * sVar23 + (long)pvVar22);
      pfVar77 = (float *)((uVar68 * 4 + 1) * sVar21 * sVar23 + (long)pvVar22);
      pfVar46 = (float *)((uVar68 * 4 + 2) * sVar21 * sVar23 + (long)pvVar22);
      pfVar72 = (float *)((uVar68 * 4 + 3) * sVar21 * sVar23 + (long)pvVar22);
      ppvVar66 = (void **)(uVar68 * 0x10 + (long)local_50);
      ppvVar58 = ppvVar66;
      if (local_50 == (void *)0x0) {
        ppvVar58 = &local_b8;
      }
      local_b8 = (void *)0x0;
      uStack_b0 = 0;
      if ((int)uVar43 < 4) {
        uVar55 = 0;
      }
      else {
        if (local_50 == (void *)0x0) {
          ppvVar66 = &local_b8;
        }
        uVar75 = 0;
        do {
          pfVar54 = (float *)((uVar75 >> 2) * uVar74 * uVar19 + (long)__ptr);
          pfVar76 = (float *)(kernel_tm->cstep * uVar68 * kernel_tm->elemsize +
                             (long)kernel_tm->data);
          fVar78 = *(float *)ppvVar58;
          fVar82 = *(float *)((long)ppvVar66 + 4);
          fVar86 = *(float *)(ppvVar66 + 1);
          fVar90 = *(float *)((long)ppvVar66 + 0xc);
          fVar79 = fVar78;
          fVar80 = fVar78;
          fVar81 = fVar78;
          fVar83 = fVar82;
          fVar84 = fVar82;
          fVar85 = fVar82;
          fVar87 = fVar86;
          fVar88 = fVar86;
          fVar89 = fVar86;
          fVar91 = fVar90;
          fVar92 = fVar90;
          fVar93 = fVar90;
          uVar51 = 0;
          if (3 < (int)uVar47) {
            iVar45 = 3;
            do {
              fVar2 = *pfVar76;
              fVar3 = pfVar76[1];
              fVar4 = pfVar76[2];
              fVar5 = pfVar76[3];
              fVar27 = *pfVar54;
              fVar28 = pfVar54[1];
              fVar29 = pfVar54[2];
              fVar30 = pfVar54[3];
              fVar31 = pfVar54[4];
              fVar32 = pfVar54[5];
              fVar33 = pfVar54[6];
              fVar34 = pfVar54[7];
              fVar35 = pfVar54[8];
              fVar36 = pfVar54[9];
              fVar37 = pfVar54[10];
              fVar38 = pfVar54[0xb];
              fVar39 = pfVar54[0xc];
              fVar40 = pfVar54[0xd];
              fVar41 = pfVar54[0xe];
              fVar42 = pfVar54[0xf];
              fVar6 = pfVar76[4];
              fVar7 = pfVar76[5];
              fVar8 = pfVar76[6];
              fVar9 = pfVar76[7];
              fVar10 = pfVar76[8];
              fVar11 = pfVar76[9];
              fVar12 = pfVar76[10];
              fVar13 = pfVar76[0xb];
              fVar14 = pfVar76[0xc];
              fVar15 = pfVar76[0xd];
              fVar16 = pfVar76[0xe];
              fVar17 = pfVar76[0xf];
              fVar78 = fVar14 * fVar39 + fVar10 * fVar35 + fVar6 * fVar31 + fVar2 * fVar27 + fVar78;
              fVar79 = fVar14 * fVar40 + fVar10 * fVar36 + fVar6 * fVar32 + fVar2 * fVar28 + fVar79;
              fVar80 = fVar14 * fVar41 + fVar10 * fVar37 + fVar6 * fVar33 + fVar2 * fVar29 + fVar80;
              fVar81 = fVar14 * fVar42 + fVar10 * fVar38 + fVar6 * fVar34 + fVar2 * fVar30 + fVar81;
              fVar82 = fVar15 * fVar39 + fVar11 * fVar35 + fVar7 * fVar31 + fVar3 * fVar27 + fVar82;
              fVar83 = fVar15 * fVar40 + fVar11 * fVar36 + fVar7 * fVar32 + fVar3 * fVar28 + fVar83;
              fVar84 = fVar15 * fVar41 + fVar11 * fVar37 + fVar7 * fVar33 + fVar3 * fVar29 + fVar84;
              fVar85 = fVar15 * fVar42 + fVar11 * fVar38 + fVar7 * fVar34 + fVar3 * fVar30 + fVar85;
              fVar86 = fVar16 * fVar39 + fVar12 * fVar35 + fVar8 * fVar31 + fVar4 * fVar27 + fVar86;
              fVar87 = fVar16 * fVar40 + fVar12 * fVar36 + fVar8 * fVar32 + fVar4 * fVar28 + fVar87;
              fVar88 = fVar16 * fVar41 + fVar12 * fVar37 + fVar8 * fVar33 + fVar4 * fVar29 + fVar88;
              fVar89 = fVar16 * fVar42 + fVar12 * fVar38 + fVar8 * fVar34 + fVar4 * fVar30 + fVar89;
              fVar90 = fVar17 * fVar39 + fVar13 * fVar35 + fVar9 * fVar31 + fVar5 * fVar27 + fVar90;
              fVar91 = fVar17 * fVar40 + fVar13 * fVar36 + fVar9 * fVar32 + fVar5 * fVar28 + fVar91;
              fVar92 = fVar17 * fVar41 + fVar13 * fVar37 + fVar9 * fVar33 + fVar5 * fVar29 + fVar92;
              fVar93 = fVar17 * fVar42 + fVar13 * fVar38 + fVar9 * fVar34 + fVar5 * fVar30 + fVar93;
              pfVar76 = pfVar76 + 0x10;
              pfVar54 = pfVar54 + 0x10;
              iVar45 = iVar45 + 4;
              uVar51 = uVar47 & 0xfffffffc;
            } while (iVar45 < (int)uVar47);
          }
          iVar45 = uVar47 - uVar51;
          if (iVar45 != 0 && (int)uVar51 <= (int)uVar47) {
            lVar61 = 0;
            do {
              pfVar62 = (float *)((long)pfVar54 + lVar61);
              fVar6 = *pfVar62;
              fVar7 = pfVar62[1];
              fVar8 = pfVar62[2];
              fVar9 = pfVar62[3];
              fVar2 = *(float *)((long)pfVar76 + lVar61);
              fVar3 = *(float *)((long)pfVar76 + lVar61 + 4);
              fVar4 = *(float *)((long)pfVar76 + lVar61 + 8);
              fVar5 = *(float *)((long)pfVar76 + lVar61 + 0xc);
              fVar78 = fVar78 + fVar2 * fVar6;
              fVar79 = fVar79 + fVar2 * fVar7;
              fVar80 = fVar80 + fVar2 * fVar8;
              fVar81 = fVar81 + fVar2 * fVar9;
              fVar82 = fVar82 + fVar3 * fVar6;
              fVar83 = fVar83 + fVar3 * fVar7;
              fVar84 = fVar84 + fVar3 * fVar8;
              fVar85 = fVar85 + fVar3 * fVar9;
              fVar86 = fVar86 + fVar4 * fVar6;
              fVar87 = fVar87 + fVar4 * fVar7;
              fVar88 = fVar88 + fVar4 * fVar8;
              fVar89 = fVar89 + fVar4 * fVar9;
              fVar90 = fVar90 + fVar5 * fVar6;
              fVar91 = fVar91 + fVar5 * fVar7;
              fVar92 = fVar92 + fVar5 * fVar8;
              fVar93 = fVar93 + fVar5 * fVar9;
              lVar61 = lVar61 + 0x10;
              iVar45 = iVar45 + -1;
            } while (iVar45 != 0);
          }
          *pfVar56 = fVar78;
          pfVar56[1] = fVar79;
          pfVar56[2] = fVar80;
          pfVar56[3] = fVar81;
          *pfVar77 = fVar82;
          pfVar77[1] = fVar83;
          pfVar77[2] = fVar84;
          pfVar77[3] = fVar85;
          *pfVar46 = fVar86;
          pfVar46[1] = fVar87;
          pfVar46[2] = fVar88;
          pfVar46[3] = fVar89;
          *pfVar72 = fVar90;
          pfVar72[1] = fVar91;
          pfVar72[2] = fVar92;
          pfVar72[3] = fVar93;
          pfVar56 = pfVar56 + 4;
          pfVar77 = pfVar77 + 4;
          pfVar46 = pfVar46 + 4;
          pfVar72 = pfVar72 + 4;
          uVar55 = uVar75 + 4;
          lVar61 = uVar75 + 7;
          uVar75 = uVar55;
        } while (lVar61 < lVar52);
      }
      if ((int)uVar55 < (int)uVar43) {
        pfVar54 = (float *)(kernel_tm->cstep * uVar68 * kernel_tm->elemsize + (long)kernel_tm->data)
        ;
        do {
          pfVar62 = (float *)((ulong)(((uint)uVar55 & 3) + ((uint)(uVar55 >> 2) & 0x3fffffff)) *
                              uVar74 * uVar19 + (long)__ptr);
          pfVar76 = pfVar54;
          if ((int)uVar47 < 4) {
            fVar78 = 0.0;
            fVar82 = 0.0;
            fVar86 = 0.0;
            fVar90 = 0.0;
            fVar89 = 0.0;
            fVar91 = 0.0;
            fVar92 = 0.0;
            fVar93 = 0.0;
            fVar84 = 0.0;
            fVar85 = 0.0;
            fVar87 = 0.0;
            fVar88 = 0.0;
            fVar79 = 0.0;
            fVar80 = 0.0;
            fVar81 = 0.0;
            fVar83 = 0.0;
            uVar51 = 0;
          }
          else {
            fVar79 = 0.0;
            fVar80 = 0.0;
            fVar81 = 0.0;
            fVar83 = 0.0;
            iVar45 = 3;
            fVar84 = 0.0;
            fVar85 = 0.0;
            fVar87 = 0.0;
            fVar88 = 0.0;
            fVar89 = 0.0;
            fVar91 = 0.0;
            fVar92 = 0.0;
            fVar93 = 0.0;
            fVar78 = 0.0;
            fVar82 = 0.0;
            fVar86 = 0.0;
            fVar90 = 0.0;
            do {
              fVar2 = *pfVar62;
              fVar3 = pfVar62[1];
              fVar4 = pfVar62[2];
              fVar5 = pfVar62[3];
              fVar78 = fVar78 + *pfVar76 * fVar2;
              fVar82 = fVar82 + pfVar76[1] * fVar2;
              fVar86 = fVar86 + pfVar76[2] * fVar2;
              fVar90 = fVar90 + pfVar76[3] * fVar2;
              fVar89 = fVar89 + pfVar76[4] * fVar3;
              fVar91 = fVar91 + pfVar76[5] * fVar3;
              fVar92 = fVar92 + pfVar76[6] * fVar3;
              fVar93 = fVar93 + pfVar76[7] * fVar3;
              fVar84 = fVar84 + pfVar76[8] * fVar4;
              fVar85 = fVar85 + pfVar76[9] * fVar4;
              fVar87 = fVar87 + pfVar76[10] * fVar4;
              fVar88 = fVar88 + pfVar76[0xb] * fVar4;
              fVar79 = fVar79 + pfVar76[0xc] * fVar5;
              fVar80 = fVar80 + pfVar76[0xd] * fVar5;
              fVar81 = fVar81 + pfVar76[0xe] * fVar5;
              fVar83 = fVar83 + pfVar76[0xf] * fVar5;
              pfVar76 = pfVar76 + 0x10;
              pfVar62 = pfVar62 + 4;
              iVar45 = iVar45 + 4;
              uVar51 = uVar47 & 0xfffffffc;
            } while (iVar45 < (int)uVar47);
          }
          fVar78 = *(float *)ppvVar58 + fVar79 + fVar78 + fVar89 + fVar84;
          fVar82 = *(float *)((long)ppvVar58 + 4) + fVar80 + fVar82 + fVar91 + fVar85;
          fVar86 = *(float *)(ppvVar58 + 1) + fVar81 + fVar86 + fVar92 + fVar87;
          fVar90 = *(float *)((long)ppvVar58 + 0xc) + fVar83 + fVar90 + fVar93 + fVar88;
          if (uVar47 - uVar51 != 0 && (int)uVar51 <= (int)uVar47) {
            lVar61 = 0;
            do {
              fVar79 = pfVar62[lVar61];
              fVar78 = fVar78 + *pfVar76 * fVar79;
              fVar82 = fVar82 + pfVar76[1] * fVar79;
              fVar86 = fVar86 + pfVar76[2] * fVar79;
              fVar90 = fVar90 + pfVar76[3] * fVar79;
              pfVar76 = pfVar76 + 4;
              lVar61 = lVar61 + 1;
            } while (uVar47 - uVar51 != (int)lVar61);
          }
          *pfVar56 = fVar78;
          *pfVar77 = fVar82;
          *pfVar46 = fVar86;
          *pfVar72 = fVar90;
          pfVar56 = pfVar56 + 1;
          pfVar77 = pfVar77 + 1;
          pfVar46 = pfVar46 + 1;
          pfVar72 = pfVar72 + 1;
          uVar51 = (uint)uVar55 + 1;
          uVar55 = (ulong)uVar51;
        } while (uVar51 != uVar43);
      }
      uVar68 = uVar68 + 1;
    } while (uVar68 != uVar50);
  }
  if ((int)uVar53 != (int)local_58) {
    do {
      if (local_50 == (void *)0x0) {
        fVar78 = 0.0;
      }
      else {
        fVar78 = *(float *)((long)local_50 + uVar53 * 4);
      }
      pfVar46 = (float *)(local_48->cstep * uVar53 * local_48->elemsize + (long)local_48->data);
      uVar68 = 0;
      uVar50 = (uint)uVar53;
      if (3 < (int)uVar43) {
        uVar51 = uVar50 + 3;
        if (-1 < (int)uVar50) {
          uVar51 = uVar50;
        }
        uVar55 = 0;
        do {
          pfVar56 = (float *)((uVar55 >> 2) * uVar74 * uVar19 + (long)__ptr);
          pfVar72 = (float *)(kernel_tm->cstep *
                              (long)(int)(((int)uVar51 >> 2) + (uVar50 - (uVar51 & 0xfffffffc))) *
                              kernel_tm->elemsize + (long)kernel_tm->data);
          fVar82 = fVar78;
          fVar86 = fVar78;
          fVar90 = fVar78;
          fVar79 = fVar78;
          uVar70 = 0;
          if (3 < (int)uVar47) {
            iVar45 = 3;
            do {
              fVar80 = *pfVar72;
              fVar81 = pfVar72[1];
              fVar83 = pfVar72[2];
              fVar84 = pfVar72[3];
              fVar82 = pfVar56[0xc] * fVar84 +
                       pfVar56[8] * fVar83 + pfVar56[4] * fVar81 + *pfVar56 * fVar80 + fVar82;
              fVar86 = pfVar56[0xd] * fVar84 +
                       pfVar56[9] * fVar83 + pfVar56[5] * fVar81 + pfVar56[1] * fVar80 + fVar86;
              fVar90 = pfVar56[0xe] * fVar84 +
                       pfVar56[10] * fVar83 + pfVar56[6] * fVar81 + pfVar56[2] * fVar80 + fVar90;
              fVar79 = pfVar56[0xf] * fVar84 +
                       pfVar56[0xb] * fVar83 + pfVar56[7] * fVar81 + pfVar56[3] * fVar80 + fVar79;
              pfVar72 = pfVar72 + 4;
              pfVar56 = pfVar56 + 0x10;
              iVar45 = iVar45 + 4;
              uVar70 = uVar47 & 0xfffffffc;
            } while (iVar45 < (int)uVar47);
          }
          if (uVar47 - uVar70 != 0 && (int)uVar70 <= (int)uVar47) {
            lVar61 = 0;
            do {
              fVar80 = pfVar72[lVar61];
              fVar82 = fVar82 + *pfVar56 * fVar80;
              fVar86 = fVar86 + pfVar56[1] * fVar80;
              fVar90 = fVar90 + pfVar56[2] * fVar80;
              fVar79 = fVar79 + pfVar56[3] * fVar80;
              pfVar56 = pfVar56 + 4;
              lVar61 = lVar61 + 1;
            } while (uVar47 - uVar70 != (int)lVar61);
          }
          *pfVar46 = fVar82;
          pfVar46[1] = fVar86;
          pfVar46[2] = fVar90;
          pfVar46[3] = fVar79;
          pfVar46 = pfVar46 + 4;
          uVar68 = uVar55 + 4;
          lVar61 = uVar55 + 7;
          uVar55 = uVar68;
        } while (lVar61 < lVar52);
      }
      if ((int)uVar68 < (int)uVar43) {
        uVar51 = uVar50 + 3;
        if (-1 < (int)uVar50) {
          uVar51 = uVar50;
        }
        pfVar56 = (float *)((long)(int)(((int)uVar51 >> 2) + (uVar50 - (uVar51 & 0xfffffffc))) *
                            kernel_tm->cstep * kernel_tm->elemsize + (long)kernel_tm->data);
        do {
          pfVar77 = (float *)((ulong)(((uint)uVar68 & 3) + ((uint)(uVar68 >> 2) & 0x3fffffff)) *
                              uVar74 * uVar19 + (long)__ptr);
          pfVar72 = pfVar56;
          if ((int)uVar47 < 4) {
            fVar82 = 0.0;
            fVar86 = 0.0;
            fVar90 = 0.0;
            fVar79 = 0.0;
            uVar50 = 0;
          }
          else {
            fVar82 = 0.0;
            fVar86 = 0.0;
            fVar90 = 0.0;
            fVar79 = 0.0;
            iVar45 = 3;
            do {
              fVar82 = fVar82 + *pfVar72 * *pfVar77;
              fVar86 = fVar86 + pfVar72[1] * pfVar77[1];
              fVar90 = fVar90 + pfVar72[2] * pfVar77[2];
              fVar79 = fVar79 + pfVar72[3] * pfVar77[3];
              pfVar72 = pfVar72 + 4;
              pfVar77 = pfVar77 + 4;
              iVar45 = iVar45 + 4;
              uVar50 = uVar47 & 0xfffffffc;
            } while (iVar45 < (int)uVar47);
          }
          fVar82 = fVar79 + fVar86 + fVar90 + fVar82 + fVar78;
          if (uVar47 - uVar50 != 0 && (int)uVar50 <= (int)uVar47) {
            lVar61 = 0;
            do {
              fVar82 = fVar82 + pfVar77[lVar61] * pfVar72[lVar61];
              lVar61 = lVar61 + 1;
            } while (uVar47 - uVar50 != (int)lVar61);
          }
          *pfVar46 = fVar82;
          pfVar46 = pfVar46 + 1;
          uVar50 = (uint)uVar68 + 1;
          uVar68 = (ulong)uVar50;
        } while (uVar50 != uVar43);
      }
      uVar53 = uVar53 + 1;
    } while ((long)uVar53 < (long)local_58);
  }
  uStack_a0 = piVar1;
  if (piVar60 != (int *)0x0) {
    LOCK();
    *piVar60 = *piVar60 + -1;
    UNLOCK();
    if (*piVar60 == 0) {
      if (pAVar20 == (Allocator *)0x0) {
        if (__ptr != (void *)0x0) {
          free(__ptr);
        }
      }
      else {
        (*pAVar20->_vptr_Allocator[3])(pAVar20,__ptr);
      }
    }
  }
  if (uStack_a0 != (int *)0x0) {
    LOCK();
    *uStack_a0 = *uStack_a0 + -1;
    UNLOCK();
    if (*uStack_a0 == 0) {
      if (local_88 == (Allocator *)0x0) {
        if (local_a8 != (void *)0x0) {
          free(local_a8);
        }
      }
      else {
        (*local_88->_vptr_Allocator[3])();
      }
    }
  }
  return;
}

Assistant:

static void conv_im2col_sgemm_sse(const Mat &bottom_blob, Mat &top_blob, const Mat & kernel_tm, const Mat& _bias, \
            const int kernel_w, const int kernel_h, const int stride_w, const int stride_h, const Option& opt)
{
    int w = bottom_blob.w;
    int inch = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;

    int outw = top_blob.w;
    int outh = top_blob.h;
    int outch = top_blob.c;

    const float* bias = _bias;

    // im2col
    Mat bottom_im2col(outw*outh, kernel_h*kernel_w*inch, elemsize, opt.workspace_allocator);
    {
        const int stride = kernel_h*kernel_w*outw*outh;
        float* ret = (float*)bottom_im2col;
    
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int p=0; p<inch; p++)
        {
            const float* input = bottom_blob.channel(p);
            int retID = stride * p;
            for (int u=0; u<kernel_h; u++)
            {
                for (int v=0; v<kernel_w; v++)
                {
                    for (int i=0; i<outh; i++)
                    {
                        for (int j=0; j<outw; j++)
                        {
                            int row = u + i * stride_h;
                            int col = v + j * stride_w;
                            int index = row * w + col;
                            ret[retID] = input[index];
                            retID++;
                        }
                    }
                }
            }
        }
    }

    int kernel_size = kernel_w * kernel_h;
    int out_size = outw * outh;

    // bottom_im2col memory packed 4 x 4
    Mat bottom_tm(4*kernel_size, inch, out_size/4 + out_size%4, elemsize, opt.workspace_allocator);
    {
        int nn_size = out_size >> 2;
        int remain_size_start = nn_size << 2;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ii=0; ii<nn_size; ii++)
        {
            int i = ii * 4;

            const float* img0 = bottom_im2col.channel(0);
            img0 += i;

            float* tmpptr = bottom_tm.channel(i/4);

            for (int q=0; q<inch*kernel_size; q++)
            {
#if __SSE__
                _mm_storeu_ps(tmpptr, _mm_loadu_ps(img0));
#else                
                tmpptr[0] = img0[0];
                tmpptr[1] = img0[1];
                tmpptr[2] = img0[2];
                tmpptr[3] = img0[3];
#endif // __SSE__              
                tmpptr += 4;
                img0 += out_size;
            }
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i=remain_size_start; i<out_size; i++)
        {
            const float* img0 = bottom_im2col.channel(0);
            img0 += i;

            float* tmpptr = bottom_tm.channel(i/4 + i%4);

            for (int q=0; q<inch*kernel_size; q++)
            {
                tmpptr[0] = img0[0];

                tmpptr += 1;
                img0 += out_size;
            }
        }
    }
    
    // sgemm(int M, int N, int L, float* A, float* B, float* C)
    {
        //int M = outch;                    // outch
        int N = outw * outh;                // outsize or out stride
        int L = kernel_w * kernel_h * inch; // ksize * inch

        int nn_outch = 0;
        int remain_outch_start = 0;

        nn_outch = outch >> 2;
        remain_outch_start = nn_outch << 2;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int pp=0; pp<nn_outch; pp++)
        {
            int i =  pp * 4;

            float* output0 = top_blob.channel(i);
            float* output1 = top_blob.channel(i+1);
            float* output2 = top_blob.channel(i+2);
            float* output3 = top_blob.channel(i+3);

            const float zeros[4] = {0.f, 0.f, 0.f, 0.f};
            const float* biasptr = bias ? bias + i : zeros;

            int j=0;
            for (; j+3<N; j=j+4)
            {
                const float* vb = bottom_tm.channel(j/4);
                const float* va = kernel_tm.channel(i/4);
#if __SSE__
                __m128 _sum0 = _mm_set1_ps(biasptr[0]);
                __m128 _sum1 = _mm_set1_ps(biasptr[1]);
                __m128 _sum2 = _mm_set1_ps(biasptr[2]);
                __m128 _sum3 = _mm_set1_ps(biasptr[3]);

                int k=0;
                for (; k+3<L; k=k+4)
                {
                    // k0
                    __m128 _vb = _mm_loadu_ps(vb);
                    __m128 _va0 = _mm_set1_ps(va[0]);
                    __m128 _va1 = _mm_set1_ps(va[1]);
                    __m128 _va2 = _mm_set1_ps(va[2]);
                    __m128 _va3 = _mm_set1_ps(va[3]);
                    _sum0 = _mm_add_ps(_sum0, _mm_mul_ps(_vb, _va0));// sum0 = (a00-a03) * k00
                    _sum1 = _mm_add_ps(_sum1, _mm_mul_ps(_vb, _va1));// sum1 = (a00-a03) * k10
                    _sum2 = _mm_add_ps(_sum2, _mm_mul_ps(_vb, _va2));// sum2 = (a00-a03) * k20
                    _sum3 = _mm_add_ps(_sum3, _mm_mul_ps(_vb, _va3));// sum3 = (a00-a03) * k30

                    // k1
                    _vb = _mm_loadu_ps(vb+4);
                    _va0 = _mm_set1_ps(va[4]);
                    _va1 = _mm_set1_ps(va[5]);
                    _va2 = _mm_set1_ps(va[6]);
                    _va3 = _mm_set1_ps(va[7]);
                    _sum0 = _mm_add_ps(_sum0, _mm_mul_ps(_vb, _va0));// sum0 = (a10-a13) * k01
                    _sum1 = _mm_add_ps(_sum1, _mm_mul_ps(_vb, _va1));// sum1 = (a10-a13) * k11
                    _sum2 = _mm_add_ps(_sum2, _mm_mul_ps(_vb, _va2));// sum2 = (a10-a13) * k21
                    _sum3 = _mm_add_ps(_sum3, _mm_mul_ps(_vb, _va3));// sum3 = (a10-a13) * k31

                    // k2
                    _vb = _mm_loadu_ps(vb+8);
                    _va0 = _mm_set1_ps(va[8]);
                    _va1 = _mm_set1_ps(va[9]);
                    _va2 = _mm_set1_ps(va[10]);
                    _va3 = _mm_set1_ps(va[11]);
                    _sum0 = _mm_add_ps(_sum0, _mm_mul_ps(_vb, _va0));// sum0 = (a20-a23) * k02
                    _sum1 = _mm_add_ps(_sum1, _mm_mul_ps(_vb, _va1));// sum1 = (a20-a23) * k12
                    _sum2 = _mm_add_ps(_sum2, _mm_mul_ps(_vb, _va2));// sum2 = (a20-a23) * k22
                    _sum3 = _mm_add_ps(_sum3, _mm_mul_ps(_vb, _va3));// sum3 = (a20-a23) * k32

                    // k3
                    _vb = _mm_loadu_ps(vb+12);
                    _va0 = _mm_set1_ps(va[12]);
                    _va1 = _mm_set1_ps(va[13]);
                    _va2 = _mm_set1_ps(va[14]);
                    _va3 = _mm_set1_ps(va[15]);
                    _sum0 = _mm_add_ps(_sum0, _mm_mul_ps(_vb, _va0));// sum0 = (a30-a33) * k03
                    _sum1 = _mm_add_ps(_sum1, _mm_mul_ps(_vb, _va1));// sum1 = (a30-a33) * k13
                    _sum2 = _mm_add_ps(_sum2, _mm_mul_ps(_vb, _va2));// sum2 = (a30-a33) * k23
                    _sum3 = _mm_add_ps(_sum3, _mm_mul_ps(_vb, _va3));// sum3 = (a30-a33) * k33

                    va += 16;
                    vb += 16;
                }

                for (; k<L; k++)
                {
                    // k0
                    __m128 _vb = _mm_loadu_ps(vb);
                    __m128 _va0 = _mm_set1_ps(va[0]);
                    __m128 _va1 = _mm_set1_ps(va[1]);
                    __m128 _va2 = _mm_set1_ps(va[2]);
                    __m128 _va3 = _mm_set1_ps(va[3]);
                    _sum0 = _mm_add_ps(_sum0, _mm_mul_ps(_vb, _va0));// sum0 = (a00-a03) * k00
                    _sum1 = _mm_add_ps(_sum1, _mm_mul_ps(_vb, _va1));// sum1 = (a00-a03) * k10
                    _sum2 = _mm_add_ps(_sum2, _mm_mul_ps(_vb, _va2));// sum2 = (a00-a03) * k20
                    _sum3 = _mm_add_ps(_sum3, _mm_mul_ps(_vb, _va3));// sum3 = (a00-a03) * k30
                    
                    va += 4;
                    vb += 4;
                }
                _mm_storeu_ps(output0, _sum0);
                _mm_storeu_ps(output1, _sum1);
                _mm_storeu_ps(output2, _sum2);
                _mm_storeu_ps(output3, _sum3);
#else
                float sum0[4] = {0};
                float sum1[4] = {0};
                float sum2[4] = {0};
                float sum3[4] = {0};
               
                int k=0;
                for (; k+7<L; k=k+8)
                {
                    for (int n=0; n<4; n++)
                    {
                        sum0[n] += va[0] * vb[n];
                        sum1[n] += va[1] * vb[n];
                        sum2[n] += va[2] * vb[n];
                        sum3[n] += va[3] * vb[n];
                        va += 4;

                        sum0[n] += va[0] * vb[n+4];
                        sum1[n] += va[1] * vb[n+4];
                        sum2[n] += va[2] * vb[n+4];
                        sum3[n] += va[3] * vb[n+4];
                        va += 4;

                        sum0[n] += va[0] * vb[n+8];
                        sum1[n] += va[1] * vb[n+8];
                        sum2[n] += va[2] * vb[n+8];
                        sum3[n] += va[3] * vb[n+8];
                        va += 4;

                        sum0[n] += va[0] * vb[n+12];
                        sum1[n] += va[1] * vb[n+12];
                        sum2[n] += va[2] * vb[n+12];
                        sum3[n] += va[3] * vb[n+12];
                        va += 4;

                        sum0[n] += va[0] * vb[n+16];
                        sum1[n] += va[1] * vb[n+16];
                        sum2[n] += va[2] * vb[n+16];
                        sum3[n] += va[3] * vb[n+16];
                        va += 4;

                        sum0[n] += va[0] * vb[n+20];
                        sum1[n] += va[1] * vb[n+20];
                        sum2[n] += va[2] * vb[n+20];
                        sum3[n] += va[3] * vb[n+20];
                        va += 4;

                        sum0[n] += va[0] * vb[n+24];
                        sum1[n] += va[1] * vb[n+24];
                        sum2[n] += va[2] * vb[n+24];
                        sum3[n] += va[3] * vb[n+24];
                        va += 4;

                        sum0[n] += va[0] * vb[n+28];
                        sum1[n] += va[1] * vb[n+28];
                        sum2[n] += va[2] * vb[n+28];
                        sum3[n] += va[3] * vb[n+28];
                        va -= 28;
                    }

                    va += 32;
                    vb += 32;
                }

                for (; k<L; k++)
                {
                    for (int n=0; n<4; n++)
                    {
                        sum0[n] += va[0] * vb[n];
                        sum1[n] += va[1] * vb[n];
                        sum2[n] += va[2] * vb[n];
                        sum3[n] += va[3] * vb[n];
                    }
                    
                    va += 4;
                    vb += 4;
                }

                for (int n=0; n<4; n++)
                {
                    output0[n] = sum0[n] + biasptr[0];
                    output1[n] = sum1[n] + biasptr[1];
                    output2[n] = sum2[n] + biasptr[2];
                    output3[n] = sum3[n] + biasptr[3];
                }
#endif // __SSE__
                output0 += 4;
                output1 += 4;
                output2 += 4;
                output3 += 4;
            }

            for (; j<N; j++)
            {                
                const float* vb = bottom_tm.channel(j/4 + j%4);
                const float* va = kernel_tm.channel(i/4);
#if __SSE__
                __m128 _sum0_3 = _mm_loadu_ps(biasptr);
                __m128 _sum0 = _mm_set1_ps(0.0);
                __m128 _sum1 = _mm_set1_ps(0.0);
                __m128 _sum2 = _mm_set1_ps(0.0);
                __m128 _sum3 = _mm_set1_ps(0.0);

                int k=0;
                for (; k+3<L; k=k+4)
                {
                    __m128 _vb0 = _mm_set1_ps(vb[0]);
                    __m128 _vb1 = _mm_set1_ps(vb[1]);
                    __m128 _vb2 = _mm_set1_ps(vb[2]);
                    __m128 _vb3 = _mm_set1_ps(vb[3]);
                    __m128 _va0 = _mm_loadu_ps(va);
                    __m128 _va1 = _mm_loadu_ps(va+4);
                    __m128 _va2 = _mm_loadu_ps(va+8);
                    __m128 _va3 = _mm_loadu_ps(va+12);

                    _sum0 = _mm_add_ps(_sum0, _mm_mul_ps(_va0, _vb0));// sum0 += (k00-k30) * a00
                    _sum1 = _mm_add_ps(_sum1, _mm_mul_ps(_va1, _vb1));// sum1 += (k01-k31) * a10
                    _sum2 = _mm_add_ps(_sum2, _mm_mul_ps(_va2, _vb2));// sum2 += (k02-k32) * a20
                    _sum3 = _mm_add_ps(_sum3, _mm_mul_ps(_va3, _vb3));// sum3 += (k03-k33) * a30

                    va += 16;
                    vb += 4;
                }

                _sum0 = _mm_add_ps(_sum0, _sum1);
                _sum2 = _mm_add_ps(_sum2, _sum3);
                _sum0_3 = _mm_add_ps(_sum0_3, _sum0);
                _sum0_3 = _mm_add_ps(_sum0_3, _sum2);

                for (; k<L; k++)
                {
                    __m128 _vb0 = _mm_set1_ps(vb[0]);
                    __m128 _va = _mm_loadu_ps(va); 

                    _sum0_3 = _mm_add_ps(_sum0_3, _mm_mul_ps(_va, _vb0));// sum0 += (k00-k30) * a00

                    va += 4;
                    vb += 1;
                }         
                output0[0] = _sum0_3[0];
                output1[0] = _sum0_3[1];
                output2[0] = _sum0_3[2];
                output3[0] = _sum0_3[3];
#else
                float sum0 = biasptr[0];
                float sum1 = biasptr[1];
                float sum2 = biasptr[2];
                float sum3 = biasptr[3];

                for (int k=0; k<L; k++)
                {
                    sum0 += va[0] * vb[0];
                    sum1 += va[1] * vb[0];
                    sum2 += va[2] * vb[0];
                    sum3 += va[3] * vb[0];

                    va += 4;
                    vb += 1;
                }
                
                output0[0] = sum0;
                output1[0] = sum1;
                output2[0] = sum2;
                output3[0] = sum3;
#endif // __SSE__
                output0++;
                output1++;
                output2++;
                output3++;
            }
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i=remain_outch_start; i<outch; i++)
        {
            float* output = top_blob.channel(i);

            const float bias0 = bias ? bias[i] : 0.f;

            int j=0;
            for (; j+3<N; j=j+4)
            {
                const float* vb = bottom_tm.channel(j/4);       
                const float* va = kernel_tm.channel(i/4 + i%4);
#if __SSE__
                __m128 _sum0 = _mm_set1_ps(bias0);

                int k=0;
                for (; k+3<L; k=k+4)
                {
                    // k0
                    __m128 _va0 = _mm_set1_ps(va[0]);
                    __m128 _va1 = _mm_set1_ps(va[1]);
                    __m128 _va2 = _mm_set1_ps(va[2]);
                    __m128 _va3 = _mm_set1_ps(va[3]);
                    __m128 _vb0 = _mm_loadu_ps(vb);
                    __m128 _vb1 = _mm_loadu_ps(vb+4);
                    __m128 _vb2 = _mm_loadu_ps(vb+8);
                    __m128 _vb3 = _mm_loadu_ps(vb+12);

                    _sum0 = _mm_add_ps(_sum0, _mm_mul_ps(_vb0, _va0));// sum0 = (a00-a03) * k00                
                    _sum0 = _mm_add_ps(_sum0, _mm_mul_ps(_vb1, _va1));// sum0 += (a10-a13) * k01
                    _sum0 = _mm_add_ps(_sum0, _mm_mul_ps(_vb2, _va2));// sum0 += (a20-a23) * k02
                    _sum0 = _mm_add_ps(_sum0, _mm_mul_ps(_vb3, _va3));// sum0 += (a30-a33) * k03
                
                    va += 4;
                    vb += 16;
                }

                for (; k<L; k++)
                {
                    // k0
                    __m128 _va0 = _mm_set1_ps(va[0]);
                    __m128 _vb0 = _mm_loadu_ps(vb);

                    _sum0 = _mm_add_ps(_sum0, _mm_mul_ps(_vb0, _va0));    // sum0 = (a00-a03) * k00

                    va += 1;
                    vb += 4;
                }
                _mm_storeu_ps(output, _sum0); 
#else                
                float sum[4] = {0};

                int k=0;
                for (; k+3<L; k=k+4)
                {
                    for (int n=0; n<4; n++)
                    {
                        sum[n] += va[0] * vb[n];
                        sum[n] += va[1] * vb[n+4];
                        sum[n] += va[2] * vb[n+8];
                        sum[n] += va[3] * vb[n+12];
                        //sum[n] += va[4] * vb[n+16];
                        //sum[n] += va[5] * vb[n+20];
                        //sum[n] += va[6] * vb[n+24];
                        //sum[n] += va[7] * vb[n+28];
                    }

                    va += 4;
                    vb += 16;
                }

                for (; k<L; k++)
                {
                    for (int n=0; n<4; n++)
                    {
                        sum[n] += va[0] * vb[n];
                    }

                    va += 1;
                    vb += 4;
                }

                for (int n=0; n<4; n++)
                {
                    output[n] = sum[n] + bias0;
                }
#endif // __SSE__
                output += 4;
            }

            for (; j<N; j++)
            {
                const float* vb = bottom_tm.channel(j/4 + j%4);
                const float* va = kernel_tm.channel(i/4 + i%4);

                int k=0;
#if __SSE__
                __m128 _sum0 = _mm_set1_ps(0.f);

                for (; k+3<L; k+=4)
                {
                    __m128 _p0 = _mm_loadu_ps(vb);
                    __m128 _k0 = _mm_loadu_ps(va);
                    _sum0 = _mm_add_ps(_sum0, _mm_mul_ps(_p0, _k0));

                    va += 4;
                    vb += 4;                    
                }
                float sum0 = bias0 + _sum0[0] + _sum0[1] + _sum0[2] + _sum0[3];
#else
                float sum0 = bias0;
#endif // __SSE__
                for (; k<L; k++)
                {
                    sum0 += va[0] * vb[0];

                    va += 1;
                    vb += 1;
                }
                output[0] = sum0;

                output++;
            }
        }
    }   
}